

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
duckdb::EmptyTableRef::Deserialize(Deserializer *deserializer)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0x68);
  *(undefined1 *)(pp_Var1 + 1) = 8;
  pp_Var1[2] = (_func_int *)(pp_Var1 + 4);
  pp_Var1[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 4) = 0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0xffffffffffffffff;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  pp_Var1[10] = (_func_int *)0x0;
  pp_Var1[0xb] = (_func_int *)0x0;
  pp_Var1[0xc] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR__TableRef_0247ec60;
  deserializer->_vptr_Deserializer = pp_Var1;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)deserializer;
}

Assistant:

unique_ptr<TableRef> EmptyTableRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<EmptyTableRef>(new EmptyTableRef());
	return std::move(result);
}